

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

int lyd_defaults_add_unres
              (lyd_node **root,int options,ly_ctx *ctx,lys_module **modules,int mod_count,
              lyd_node *data_tree,lyd_node *act_notif,unres_data *unres,int wd)

{
  lyd_node *plVar1;
  int iVar2;
  lys_node *local_90;
  lyd_node **local_88;
  lys_node *local_80;
  int local_74;
  ly_set *plStack_70;
  int ret;
  ly_set *set;
  lys_node *msg_op;
  lyd_node *data_tree_parent;
  lyd_node *data_tree_sibling;
  lyd_node *msg_parent;
  lyd_node *msg_sibling;
  lyd_node *data_tree_local;
  int mod_count_local;
  lys_module **modules_local;
  ly_ctx *ctx_local;
  int options_local;
  lyd_node **root_local;
  
  msg_parent = (lyd_node *)0x0;
  data_tree_sibling = (lyd_node *)0x0;
  set = (ly_set *)0x0;
  local_74 = 1;
  if (((root == (lyd_node **)0x0) ||
      (((*root == (lyd_node *)0x0 && (ctx == (ly_ctx *)0x0)) || (unres == (unres_data *)0x0)))) ||
     ((options & 0x100U) != 0)) {
    __assert_fail("root && (*root || ctx) && unres && !(options & LYD_OPT_ACT_NOTIF)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                  ,0x1dd8,
                  "int lyd_defaults_add_unres(struct lyd_node **, int, struct ly_ctx *, const struct lys_module **, int, const struct lyd_node *, struct lyd_node *, struct unres_data *, int)"
                 );
  }
  modules_local = (lys_module **)ctx;
  if (ctx == (ly_ctx *)0x0) {
    modules_local = (lys_module **)(*root)->schema->module->ctx;
  }
  if (((options & 0x1000U) != 0) && (*root == (lyd_node *)0x0)) {
    ly_log((ly_ctx *)modules_local,LY_LLERR,LY_EINVAL,
           "Cannot add default values for one module (LYD_OPT_NOSIBLINGS) without any data.");
    return 1;
  }
  ctx_local._4_4_ = options;
  if ((options & 0x70U) == 0) {
    if ((*root != (lyd_node *)0x0) && ((*root)->parent != (lyd_node *)0x0)) {
      ctx_local._4_4_ = options | 0x1000;
    }
  }
  else {
    if (*root == (lyd_node *)0x0) {
      ly_log((ly_ctx *)modules_local,LY_LLERR,LY_EINVAL,
             "Cannot add default values to RPC, RPC reply, and notification without at least the empty container."
            );
      return 1;
    }
    if ((((options & 0x10U) != 0) && (act_notif == (lyd_node *)0x0)) &&
       ((*root)->schema->nodetype != LYS_RPC)) {
      ly_log((ly_ctx *)modules_local,LY_LLERR,LY_EINVAL,"Not valid RPC/action data.");
      return 1;
    }
    if ((((options & 0x20U) != 0) && (act_notif == (lyd_node *)0x0)) &&
       ((*root)->schema->nodetype != LYS_RPC)) {
      ly_log((ly_ctx *)modules_local,LY_LLERR,LY_EINVAL,"Not valid reply data.");
      return 1;
    }
    if ((((options & 0x40U) != 0) && (act_notif == (lyd_node *)0x0)) &&
       ((*root)->schema->nodetype != LYS_NOTIF)) {
      ly_log((ly_ctx *)modules_local,LY_LLERR,LY_EINVAL,"Not valid notification data.");
      return 1;
    }
    if (act_notif == (lyd_node *)0x0) {
      local_80 = (*root)->schema;
    }
    else {
      local_80 = act_notif->schema;
    }
    set = (ly_set *)local_80;
  }
  if (wd != 0) {
    local_88 = root;
    if (act_notif != (lyd_node *)0x0) {
      local_88 = &act_notif;
    }
    iVar2 = lyd_wd_add(local_88,(ly_ctx *)modules_local,modules,mod_count,unres,ctx_local._4_4_);
    if (iVar2 != 0) {
      return 1;
    }
  }
  if ((unres == (unres_data *)0x0) || (unres->count == 0)) {
    return 0;
  }
  if (*root == (lyd_node *)0x0) {
    ly_log((ly_ctx *)modules_local,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
           ,0x1e06);
    return 1;
  }
  if ((data_tree != (lyd_node *)0x0) && ((ctx_local._4_4_ & 0x70) != 0)) {
    data_tree_sibling = (lyd_node *)0x0;
    msg_parent = *root;
    if (act_notif == (lyd_node *)0x0) {
      msg_op = (lys_node *)0x0;
      data_tree_parent = data_tree;
    }
    else {
      msg_op = (lys_node *)0x0;
      plVar1 = data_tree;
      do {
        do {
          data_tree_parent = plVar1;
          if (data_tree_parent == (lyd_node *)0x0) goto LAB_001a6a61;
          while ((data_tree_parent != (lyd_node *)0x0 &&
                 ((data_tree_parent->schema != msg_parent->schema ||
                  ((msg_parent->schema->nodetype == LYS_LIST &&
                   (iVar2 = lyd_list_equal(data_tree_parent,msg_parent,0), iVar2 == 0))))))) {
            data_tree_parent = data_tree_parent->next;
          }
          plVar1 = data_tree_parent;
        } while (data_tree_parent == (lyd_node *)0x0);
        msg_op = (lys_node *)data_tree_parent;
        data_tree_sibling = msg_parent;
        if (msg_parent->child == (lyd_node *)0x0) {
          __assert_fail("msg_sibling->child",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                        ,0x1e27,
                        "int lyd_defaults_add_unres(struct lyd_node **, int, struct ly_ctx *, const struct lys_module **, int, const struct lyd_node *, struct lyd_node *, struct unres_data *, int)"
                       );
        }
        msg_parent = msg_parent->child;
        while (msg_parent->schema->nodetype == LYS_LEAF) {
          if (msg_parent->next == (lyd_node *)0x0) {
            __assert_fail("msg_sibling->next",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                          ,0x1e2b,
                          "int lyd_defaults_add_unres(struct lyd_node **, int, struct ly_ctx *, const struct lys_module **, int, const struct lyd_node *, struct lyd_node *, struct unres_data *, int)"
                         );
          }
          msg_parent = msg_parent->next;
        }
        plVar1 = data_tree_parent->child;
      } while ((msg_parent->schema->nodetype & (LYS_ACTION|LYS_NOTIF)) == LYS_UNKNOWN);
      if (act_notif->parent == (lyd_node *)0x0) {
        __assert_fail("act_notif->parent",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                      ,0x1e2f,
                      "int lyd_defaults_add_unres(struct lyd_node **, int, struct ly_ctx *, const struct lys_module **, int, const struct lyd_node *, struct lyd_node *, struct unres_data *, int)"
                     );
      }
      if (act_notif->parent->schema != data_tree_parent->schema) {
        __assert_fail("act_notif->parent->schema == data_tree_parent->schema",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                      ,0x1e30,
                      "int lyd_defaults_add_unres(struct lyd_node **, int, struct ly_ctx *, const struct lys_module **, int, const struct lyd_node *, struct lyd_node *, struct unres_data *, int)"
                     );
      }
      data_tree_parent = data_tree_parent->child;
      if (msg_parent != act_notif) {
        __assert_fail("msg_sibling == act_notif",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                      ,0x1e31,
                      "int lyd_defaults_add_unres(struct lyd_node **, int, struct ly_ctx *, const struct lys_module **, int, const struct lyd_node *, struct lyd_node *, struct unres_data *, int)"
                     );
      }
LAB_001a6a61:
      if (msg_op == (lys_node *)0x0) {
        data_tree_parent = data_tree;
      }
    }
    lyd_unlink_internal(msg_parent,0);
    if ((msg_op == (lys_node *)0x0) && (data_tree_parent == (lyd_node *)0x0)) {
      __assert_fail("data_tree_parent || data_tree_sibling",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                    ,0x1e46,
                    "int lyd_defaults_add_unres(struct lyd_node **, int, struct ly_ctx *, const struct lys_module **, int, const struct lyd_node *, struct lyd_node *, struct unres_data *, int)"
                   );
    }
    if (msg_op == (lys_node *)0x0) {
      if (data_tree_parent->parent != (lyd_node *)0x0) {
        __assert_fail("!data_tree_sibling->parent",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                      ,0x1e4c,
                      "int lyd_defaults_add_unres(struct lyd_node **, int, struct ly_ctx *, const struct lys_module **, int, const struct lyd_node *, struct lyd_node *, struct unres_data *, int)"
                     );
      }
      iVar2 = lyd_insert_nextto(data_tree_parent->prev,msg_parent,0,0);
    }
    else {
      iVar2 = lyd_insert_common((lyd_node *)msg_op,(lyd_node **)0x0,msg_parent,0);
    }
    if (iVar2 != 0) goto LAB_001a6c86;
  }
  iVar2 = resolve_unres_data((ly_ctx *)modules_local,unres,root,ctx_local._4_4_);
  if ((iVar2 == 0) && (local_74 = 0, (ctx_local._4_4_ & 0x70) != 0)) {
    plStack_70 = (ly_set *)0x0;
    if (data_tree == (lyd_node *)0x0) {
      if ((*root != (lyd_node *)0x0) &&
         ((plStack_70 = lyd_find_instance(*root,(lys_node *)set), plStack_70 == (ly_set *)0x0 ||
          ((plStack_70->number != 0 && (plStack_70->number != 1)))))) {
        __assert_fail("set && ((set->number == 0) || (set->number == 1))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                      ,0x1e62,
                      "int lyd_defaults_add_unres(struct lyd_node **, int, struct ly_ctx *, const struct lys_module **, int, const struct lyd_node *, struct lyd_node *, struct unres_data *, int)"
                     );
      }
    }
    else {
      if (msg_op == (lys_node *)0x0) {
        local_90 = (lys_node *)data_tree_parent;
      }
      else {
        local_90 = msg_op;
      }
      plStack_70 = lyd_find_instance((lyd_node *)local_90,(lys_node *)set);
      if ((plStack_70 == (ly_set *)0x0) || ((plStack_70->number != 0 && (plStack_70->number != 1))))
      {
        __assert_fail("set && ((set->number == 0) || (set->number == 1))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                      ,0x1e5f,
                      "int lyd_defaults_add_unres(struct lyd_node **, int, struct ly_ctx *, const struct lys_module **, int, const struct lyd_node *, struct lyd_node *, struct unres_data *, int)"
                     );
      }
    }
    if ((plStack_70 == (ly_set *)0x0) || (plStack_70->number == 0)) {
      ly_vlog((ly_ctx *)modules_local,LYE_SPEC,LY_VLOG_LYS,set,
              "Operation/notification not supported because of the current configuration.");
      local_74 = 1;
    }
    ly_set_free(plStack_70);
  }
LAB_001a6c86:
  if (((data_tree != (lyd_node *)0x0) && ((ctx_local._4_4_ & 0x70) != 0)) &&
     (lyd_unlink_internal(msg_parent,0), data_tree_sibling != (lyd_node *)0x0)) {
    lyd_insert_common(data_tree_sibling,(lyd_node **)0x0,msg_parent,0);
  }
  return local_74;
}

Assistant:

int
lyd_defaults_add_unres(struct lyd_node **root, int options, struct ly_ctx *ctx, const struct lys_module **modules,
                       int mod_count, const struct lyd_node *data_tree, struct lyd_node *act_notif,
                       struct unres_data *unres, int wd)
{
    struct lyd_node *msg_sibling = NULL, *msg_parent = NULL, *data_tree_sibling, *data_tree_parent;
    struct lys_node *msg_op = NULL;
    struct ly_set *set;
    int ret = EXIT_FAILURE;

    assert(root && (*root || ctx) && unres && !(options & LYD_OPT_ACT_NOTIF));

    if (!ctx) {
        ctx = (*root)->schema->module->ctx;
    }

    if ((options & LYD_OPT_NOSIBLINGS) && !(*root)) {
        LOGERR(ctx, LY_EINVAL, "Cannot add default values for one module (LYD_OPT_NOSIBLINGS) without any data.");
        return EXIT_FAILURE;
    }

    if (options & (LYD_OPT_RPC | LYD_OPT_RPCREPLY | LYD_OPT_NOTIF)) {
        if (!(*root)) {
            LOGERR(ctx, LY_EINVAL, "Cannot add default values to RPC, RPC reply, and notification without at least the empty container.");
            return EXIT_FAILURE;
        }
        if ((options & LYD_OPT_RPC) && !act_notif && ((*root)->schema->nodetype != LYS_RPC)) {
            LOGERR(ctx, LY_EINVAL, "Not valid RPC/action data.");
            return EXIT_FAILURE;
        }
        if ((options & LYD_OPT_RPCREPLY) && !act_notif && ((*root)->schema->nodetype != LYS_RPC)) {
            LOGERR(ctx, LY_EINVAL, "Not valid reply data.");
            return EXIT_FAILURE;
        }
        if ((options & LYD_OPT_NOTIF) && !act_notif && ((*root)->schema->nodetype != LYS_NOTIF)) {
            LOGERR(ctx, LY_EINVAL, "Not valid notification data.");
            return EXIT_FAILURE;
        }

        /* remember the operation/notification schema */
        msg_op = act_notif ? act_notif->schema : (*root)->schema;
    } else if (*root && (*root)->parent) {
        /* we have inner node, so it will be considered as
         * a root of subtree where to add default nodes and
         * no of its siblings will be affected */
        options |= LYD_OPT_NOSIBLINGS;
    }

    /* add missing default nodes */
    if (wd && lyd_wd_add((act_notif ? &act_notif : root), ctx, modules, mod_count, unres, options)) {
        return EXIT_FAILURE;
    }

    /* check leafrefs and/or instids if any */
    if (unres && unres->count) {
        if (!(*root)) {
            LOGINT(ctx);
            return EXIT_FAILURE;
        }

        /* temporarily link the additional data tree to the RPC/action/notification */
        if (data_tree && (options & (LYD_OPT_RPC | LYD_OPT_RPCREPLY | LYD_OPT_NOTIF))) {
            /* duplicate the message tree - if it gets deleted we would not be able to positively identify it */
            msg_parent = NULL;
            msg_sibling = *root;

            if (act_notif) {
                /* fun case */
                data_tree_parent = NULL;
                data_tree_sibling = (struct lyd_node *)data_tree;
                while (data_tree_sibling) {
                    while (data_tree_sibling) {
                        if ((data_tree_sibling->schema == msg_sibling->schema)
                                && ((msg_sibling->schema->nodetype != LYS_LIST)
                                    || lyd_list_equal(data_tree_sibling, msg_sibling, 0))) {
                            /* match */
                            break;
                        }

                        data_tree_sibling = data_tree_sibling->next;
                    }

                    if (data_tree_sibling) {
                        /* prepare for the new data_tree iteration */
                        data_tree_parent = data_tree_sibling;
                        data_tree_sibling = data_tree_sibling->child;

                        /* find new action sibling to search for later (skip list keys) */
                        msg_parent = msg_sibling;
                        assert(msg_sibling->child);
                        for (msg_sibling = msg_sibling->child;
                                msg_sibling->schema->nodetype == LYS_LEAF;
                                msg_sibling = msg_sibling->next) {
                            assert(msg_sibling->next);
                        }
                        if (msg_sibling->schema->nodetype & (LYS_ACTION | LYS_NOTIF)) {
                            /* we are done */
                            assert(act_notif->parent);
                            assert(act_notif->parent->schema == data_tree_parent->schema);
                            assert(msg_sibling == act_notif);
                            break;
                        }
                    }
                }

                /* loop ended after the first iteration, set the values correctly */
                if (!data_tree_parent) {
                    data_tree_sibling = (struct lyd_node *)data_tree;
                }

            } else {
                /* easy case */
                data_tree_parent = NULL;
                data_tree_sibling = (struct lyd_node *)data_tree;
            }

            /* unlink msg_sibling if needed (won't do anything otherwise) */
            lyd_unlink_internal(msg_sibling, 0);

            /* now we can insert msg_sibling into data_tree_parent or next to data_tree_sibling */
            assert(data_tree_parent || data_tree_sibling);
            if (data_tree_parent) {
                if (lyd_insert_common(data_tree_parent, NULL, msg_sibling, 0)) {
                    goto unlink_datatree;
                }
            } else {
                assert(!data_tree_sibling->parent);
                if (lyd_insert_nextto(data_tree_sibling->prev, msg_sibling, 0, 0)) {
                    goto unlink_datatree;
                }
            }
        }

        if (resolve_unres_data(ctx, unres, root, options)) {
            goto unlink_datatree;
        }

        /* we are done */
        ret = EXIT_SUCCESS;

        /* check that the operation/notification tree was not removed */
        if (options & (LYD_OPT_RPC | LYD_OPT_RPCREPLY | LYD_OPT_NOTIF)) {
            set = NULL;
            if (data_tree) {
                set = lyd_find_instance(data_tree_parent ? data_tree_parent : data_tree_sibling, msg_op);
                assert(set && ((set->number == 0) || (set->number == 1)));
            } else if (*root) {
                set = lyd_find_instance(*root, msg_op);
                assert(set && ((set->number == 0) || (set->number == 1)));
            }
            if (!set || !set->number) {
                /* it was removed, handle specially */
                LOGVAL(ctx, LYE_SPEC, LY_VLOG_LYS, msg_op, "Operation/notification not supported because of the current configuration.");
                ret = EXIT_FAILURE;
            }
            ly_set_free(set);
        }

unlink_datatree:
        /* put the trees back in order */
        if (data_tree && (options & (LYD_OPT_RPC | LYD_OPT_RPCREPLY | LYD_OPT_NOTIF))) {
            /* unlink and insert it back, if there is a parent  */
            lyd_unlink_internal(msg_sibling, 0);
            if (msg_parent) {
                lyd_insert_common(msg_parent, NULL, msg_sibling, 0);
            }
        }
    } else {
        /* we are done */
        ret = EXIT_SUCCESS;
    }

    return ret;
}